

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_subroutine(Parser *this)

{
  VM_Writer *pVVar1;
  bool bVar2;
  int n_locals;
  ostream *poVar3;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  allocator<char> local_359;
  string local_358;
  int local_338;
  allocator<char> local_331;
  int n_args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  int local_2cc;
  undefined1 local_2c8 [4];
  int n_args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string return_type;
  string name;
  Parser *this_local;
  
  poVar3 = std::operator<<((ostream *)this->out_file,"\t<subroutine>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)(return_type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_90,"\t\t<keyword>",&this->cur_subroutine_type);
  std::operator+(&local_70,&local_90,"</keyword>");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  bVar2 = std::operator==(&this->cur_subroutine_type,"constructor");
  if (bVar2) {
    Tokenizer::get_current_token_abi_cxx11_(&local_c0,this->tokenizer);
    bVar2 = std::operator!=(&local_c0,&this->class_name);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid constructor identifier");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"new",&local_e1);
    check_expected_x_after_y(this,&local_e0,&this->class_name);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_128,"\t\t<keyword>",&this->cur_token);
    std::operator+(&local_108,&local_128,"</keyword>");
    poVar3 = std::operator<<(poVar3,(string *)&local_108);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    query_tokenizer(this);
  }
  else {
    bVar2 = Tokenizer::type_exists(this->tokenizer,&this->cur_token);
    if ((bVar2) || (bVar2 = std::operator==(&this->cur_token,"void"), bVar2)) {
      std::__cxx11::string::operator=((string *)local_50,(string *)&this->cur_token);
      poVar3 = (ostream *)this->out_file;
      std::operator+(&local_168,"\t\t<keyword>",&this->cur_token);
      std::operator+(&local_148,&local_168,"</keyword>");
      poVar3 = std::operator<<(poVar3,(string *)&local_148);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      query_tokenizer(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"IDENTIFIER",&local_189);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"subroutine definition",&local_1b1);
      check_token_type_x_after_y(this,&local_188,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      poVar3 = (ostream *)this->out_file;
      std::operator+(&local_1f8,"\t\t<identifier>",&this->cur_token);
      std::operator+(&local_1d8,&local_1f8,"</identifier>");
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::operator=
                ((string *)(return_type.field_2._M_local_buf + 8),(string *)&this->cur_token);
      query_tokenizer(this);
    }
    else {
      std::operator+(&local_238,"Compiler Error: \'",&this->cur_token);
      std::operator+(&local_218,&local_238,"\' not a valid type for a subroutine");
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_218);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"(",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"identifier",&local_281);
  check_expected_x_after_y(this,&local_258,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>(</symbol>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  bVar2 = std::operator==(&this->cur_subroutine_type,"constructor");
  if (bVar2) {
    parse_param_list(this);
    pVVar1 = this->vm_writer;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                   &this->class_name,".");
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&return_type.field_2 + 8));
    n_locals = Symbol_Table::get_temp_arg_count(&this->symbol_table);
    VM_Writer::write_function(pVVar1,&local_2a8,n_locals);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2c8);
  }
  else {
    bVar2 = std::operator==(&this->cur_subroutine_type,"function");
    if (bVar2) {
      parse_param_list(this);
      local_2cc = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      pVVar1 = this->vm_writer;
      std::operator+(&local_310,&this->class_name,".");
      std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&return_type.field_2 + 8));
      VM_Writer::write_function(pVVar1,&local_2f0,local_2cc);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&n_args_1,"function",&local_331);
      Symbol_Table::set_function_data
                (&this->symbol_table,(string *)((long)&return_type.field_2 + 8),(string *)&n_args_1,
                 local_2cc);
      std::__cxx11::string::~string((string *)&n_args_1);
      std::allocator<char>::~allocator(&local_331);
    }
    else {
      parse_param_list(this);
      local_338 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"method",&local_359);
      Symbol_Table::set_function_data
                (&this->symbol_table,(string *)((long)&return_type.field_2 + 8),&local_358,local_338
                );
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
      pVVar1 = this->vm_writer;
      std::operator+(&local_3a0,&this->class_name,".");
      std::operator+(&local_380,&local_3a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&return_type.field_2 + 8));
      VM_Writer::write_function(pVVar1,&local_380,local_338 + 1);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      pVVar1 = this->vm_writer;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"argument",&local_3c1)
      ;
      VM_Writer::write_push(pVVar1,&local_3c0,0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      pVVar1 = this->vm_writer;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"this",&local_3e9);
      VM_Writer::write_pop(pVVar1,&local_3e8,0);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,")",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"parameter list",&local_439);
  check_expected_x_after_y(this,&local_410,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>)</symbol>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  parse_subroutine_body(this);
  bVar2 = std::operator==(&this->cur_subroutine_type,"function");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"void"), bVar2)) {
    pVVar1 = this->vm_writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"constant",&local_461);
    VM_Writer::write_push(pVVar1,&local_460,0);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
  }
  VM_Writer::write_return(this->vm_writer);
  poVar3 = std::operator<<((ostream *)this->out_file,"\t</subroutine>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Symbol_Table::start_subroutine(&this->symbol_table);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Parser::parse_subroutine() {
    out_file << "\t<subroutine>" << std::endl;

    std::string name, return_type;
    out_file << "\t\t<keyword>" + cur_subroutine_type + "</keyword>" << std::endl;

    if (cur_subroutine_type == "constructor") {
        if (tokenizer.get_current_token() != class_name) {
            std::cerr << "Invalid constructor identifier" << std::endl;
            exit(0);
        }

        query_tokenizer();

        check_expected_x_after_y("new", class_name);
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();
    }

    else if (tokenizer.type_exists(cur_token) || cur_token == "void") {
        return_type = cur_token;
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "subroutine definition");
        out_file << "\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        name = cur_token;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: '" + cur_token + "' not a valid type for a subroutine"
        << std::endl;
    }
    check_expected_x_after_y("(", "identifier");
    out_file << "\t\t<symbol>(</symbol>" << std::endl;
    query_tokenizer();

    if (cur_subroutine_type == "constructor") {
        parse_param_list();
        vm_writer.write_function(class_name+"."+name, symbol_table.get_temp_arg_count());
    }
    else if (cur_subroutine_type == "function") {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        vm_writer.write_function(class_name + "." + name, n_args);
        symbol_table.set_function_data(name, "function", n_args);

    }
    else {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        symbol_table.set_function_data(name, "method", n_args);
        vm_writer.write_function(class_name + "." + name, n_args + 1);
        vm_writer.write_push("argument", 0);
        vm_writer.write_pop("this", 0);

    }


    check_expected_x_after_y(")", "parameter list");
    out_file << "\t\t<symbol>)</symbol>" << std::endl;

    query_tokenizer();
    parse_subroutine_body();

    // functions and void return type methods are specified to return 0;
    if (cur_subroutine_type == "function" || return_type == "void") {
        vm_writer.write_push("constant", 0);
    }
    vm_writer.write_return();
    out_file << "\t</subroutine>" << std::endl;
    symbol_table.start_subroutine();
}